

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pair<QHttpNetworkRequest,_QHttpNetworkReply_*> * __thiscall
QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::takeAt
          (QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,qsizetype i)

{
  char *in_RDX;
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_RSI;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_RDI;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *t;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *this_00;
  
  ((DataPointer *)&in_RDI->first)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->first)->ptr =
       (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0xaaaaaaaaaaaaaaaa;
  in_RDI->second = (QHttpNetworkReply *)0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  operator[]((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI,(qsizetype)in_RDI
            );
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair(this_00,in_RDI);
  remove(in_RSI,in_RDX);
  return in_RDI;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }